

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O3

int __thiscall
absl::strings_internal::BigUnsigned<84>::ReadDigits
          (BigUnsigned<84> *this,char *begin,char *end,int significant_digits)

{
  uint32_t *puVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  
  if (0x32a < significant_digits) {
    __assert_fail("significant_digits <= Digits10() + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_bigint.cc"
                  ,0xc3,
                  "int absl::strings_internal::BigUnsigned<84>::ReadDigits(const char *, const char *, int) [max_words = 84]"
                 );
  }
  if (0 < (long)this->size_) {
    memset(this->words_,0,(long)this->size_ << 2);
  }
  this->size_ = 0;
  pcVar7 = begin;
  if (begin < end) {
    do {
      begin = pcVar7;
      if (*begin != '0') break;
      pcVar7 = begin + 1;
      begin = end;
    } while (pcVar7 != end);
  }
  if (begin < end) {
    iVar3 = (int)end - (int)begin;
    iVar9 = 0;
    end = end + -1;
    do {
      if (*end != '0') {
        if (*end == '.') {
          if (end <= begin) goto LAB_0026d760;
          iVar9 = 0;
          goto LAB_0026d722;
        }
        pcVar7 = end + 1;
        iVar3 = iVar9;
        break;
      }
      iVar9 = iVar9 + 1;
      bVar11 = begin < end;
      pcVar7 = begin;
      end = end + -1;
    } while (bVar11);
    end = pcVar7;
    if (iVar3 != 0) {
      pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (begin,pcVar7);
      iVar9 = 0;
      if (pcVar5 == pcVar7) {
        iVar9 = iVar3;
      }
      goto LAB_0026d763;
    }
  }
LAB_0026d760:
  pcVar7 = end;
  iVar9 = 0;
  goto LAB_0026d763;
  while( true ) {
    iVar9 = iVar9 + 1;
    end = end + -1;
    pcVar7 = begin;
    if (end <= begin) break;
LAB_0026d722:
    pcVar7 = end;
    if (end[-1] != '0') break;
  }
LAB_0026d763:
  if (significant_digits < 1 || begin == pcVar7) {
    if (pcVar7 <= begin) {
      return iVar9;
    }
  }
  else {
    iVar3 = 0;
    uVar10 = 0;
    bVar8 = 0;
    do {
      cVar2 = *begin;
      if (cVar2 == '.') {
        bVar8 = 1;
      }
      else {
        cVar6 = cVar2 + -0x30;
        significant_digits = significant_digits + -1;
        if (((significant_digits == 0) && (begin + 1 != pcVar7)) &&
           ((cVar2 == '5' || (cVar2 == '0')))) {
          cVar6 = cVar2 + -0x2f;
        }
        iVar9 = iVar9 - (uint)bVar8;
        uVar10 = (int)cVar6 + uVar10 * 10;
        iVar3 = iVar3 + 1;
        if (iVar3 == 9) {
          MultiplyBy(this,1000000000);
          if (uVar10 != 0) {
            uVar4 = 0;
            do {
              puVar1 = this->words_ + uVar4;
              bVar11 = CARRY4(*puVar1,uVar10);
              *puVar1 = *puVar1 + uVar10;
              uVar4 = uVar4 + bVar11;
              if (!bVar11) break;
              uVar10 = (uint)bVar11;
            } while (uVar4 < 0x54);
            uVar10 = uVar4 + 1;
            if ((int)(uVar4 + 1) <= this->size_) {
              uVar10 = this->size_;
            }
            if (0x53 < uVar10) {
              uVar10 = 0x54;
            }
            this->size_ = uVar10;
          }
          uVar10 = 0;
          iVar3 = 0;
        }
      }
      begin = begin + 1;
    } while ((begin != pcVar7) && (0 < significant_digits));
    if ((iVar3 != 0) && (MultiplyBy(this,(&kTenToNth)[iVar3]), uVar10 != 0)) {
      uVar4 = 0;
      do {
        puVar1 = this->words_ + uVar4;
        bVar11 = CARRY4(*puVar1,uVar10);
        *puVar1 = *puVar1 + uVar10;
        uVar4 = uVar4 + bVar11;
        if (!bVar11) break;
        uVar10 = (uint)bVar11;
      } while (uVar4 < 0x54);
      uVar10 = uVar4 + 1;
      if ((int)(uVar4 + 1) <= this->size_) {
        uVar10 = this->size_;
      }
      uVar4 = 0x54;
      if (uVar10 < 0x54) {
        uVar4 = uVar10;
      }
      this->size_ = uVar4;
    }
    if (pcVar7 <= begin || bVar8 != 0) {
      return iVar9;
    }
  }
  pcVar7 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(begin,pcVar7);
  return ((int)pcVar7 - (int)begin) + iVar9;
}

Assistant:

int BigUnsigned<max_words>::ReadDigits(const char* begin, const char* end,
                                       int significant_digits) {
  assert(significant_digits <= Digits10() + 1);
  SetToZero();

  bool after_decimal_point = false;
  // Discard any leading zeroes before the decimal point
  while (begin < end && *begin == '0') {
    ++begin;
  }
  int dropped_digits = 0;
  // Discard any trailing zeroes.  These may or may not be after the decimal
  // point.
  while (begin < end && *std::prev(end) == '0') {
    --end;
    ++dropped_digits;
  }
  if (begin < end && *std::prev(end) == '.') {
    // If the string ends in '.', either before or after dropping zeroes, then
    // drop the decimal point and look for more digits to drop.
    dropped_digits = 0;
    --end;
    while (begin < end && *std::prev(end) == '0') {
      --end;
      ++dropped_digits;
    }
  } else if (dropped_digits) {
    // We dropped digits, and aren't sure if they're before or after the decimal
    // point.  Figure that out now.
    const char* dp = std::find(begin, end, '.');
    if (dp != end) {
      // The dropped trailing digits were after the decimal point, so don't
      // count them.
      dropped_digits = 0;
    }
  }
  // Any non-fraction digits we dropped need to be accounted for in our exponent
  // adjustment.
  int exponent_adjust = dropped_digits;

  uint32_t queued = 0;
  int digits_queued = 0;
  for (; begin != end && significant_digits > 0; ++begin) {
    if (*begin == '.') {
      after_decimal_point = true;
      continue;
    }
    if (after_decimal_point) {
      // For each fractional digit we emit in our parsed integer, adjust our
      // decimal exponent to compensate.
      --exponent_adjust;
    }
    char digit = (*begin - '0');
    --significant_digits;
    if (significant_digits == 0 && std::next(begin) != end &&
        (digit == 0 || digit == 5)) {
      // If this is the very last significant digit, but insignificant digits
      // remain, we know that the last of those remaining significant digits is
      // nonzero.  (If it wasn't, we would have stripped it before we got here.)
      // So if this final digit is a 0 or 5, adjust it upward by 1.
      //
      // This adjustment is what allows incredibly large mantissas ending in
      // 500000...000000000001 to correctly round up, rather than to nearest.
      ++digit;
    }
    queued = 10 * queued + static_cast<uint32_t>(digit);
    ++digits_queued;
    if (digits_queued == kMaxSmallPowerOfTen) {
      MultiplyBy(kTenToNth[kMaxSmallPowerOfTen]);
      AddWithCarry(0, queued);
      queued = digits_queued = 0;
    }
  }
  // Encode any remaining digits.
  if (digits_queued) {
    MultiplyBy(kTenToNth[digits_queued]);
    AddWithCarry(0, queued);
  }

  // If any insignificant digits remain, we will drop them.  But if we have not
  // yet read the decimal point, then we have to adjust the exponent to account
  // for the dropped digits.
  if (begin < end && !after_decimal_point) {
    // This call to std::find will result in a pointer either to the decimal
    // point, or to the end of our buffer if there was none.
    //
    // Either way, [begin, decimal_point) will contain the set of dropped digits
    // that require an exponent adjustment.
    const char* decimal_point = std::find(begin, end, '.');
    exponent_adjust += (decimal_point - begin);
  }
  return exponent_adjust;
}